

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ParseUInt64(string_view str,uint64_t *out)

{
  string_view str_00;
  bool bVar1;
  unsigned_long *in_RDX;
  size_t in_RSI;
  long in_FS_OFFSET;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  str_00._M_str = pcVar2;
  str_00._M_len = in_RSI;
  bVar1 = anon_unknown.dwarf_e93f8::ParseIntegral<unsigned_long>(str_00,in_RDX);
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseUInt64(std::string_view str, uint64_t* out)
{
    return ParseIntegral<uint64_t>(str, out);
}